

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

int png_xy_from_XYZ(png_xy *xy,png_XYZ *XYZ)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  png_fixed_point pVar11;
  double dVar12;
  double dVar13;
  
  iVar9 = XYZ->red_X;
  iVar5 = 1;
  iVar10 = XYZ->red_Y + iVar9 + XYZ->red_Z;
  if (iVar10 != 0) {
    pVar11 = 0;
    iVar6 = 0;
    if (iVar9 != 0) {
      dVar12 = floor(((double)iVar9 * 100000.0) / (double)iVar10 + 0.5);
      if (2147483647.0 < dVar12) {
        return 1;
      }
      if (dVar12 < -2147483648.0) {
        return 1;
      }
      iVar6 = (int)dVar12;
    }
    xy->redx = iVar6;
    if (XYZ->red_Y != 0) {
      dVar12 = floor(((double)XYZ->red_Y * 100000.0) / (double)iVar10 + 0.5);
      if (2147483647.0 < dVar12) {
        return 1;
      }
      if (dVar12 < -2147483648.0) {
        return 1;
      }
      pVar11 = (png_fixed_point)dVar12;
    }
    xy->redy = pVar11;
    iVar9 = XYZ->green_X;
    iVar6 = XYZ->green_Y + iVar9 + XYZ->green_Z;
    if (iVar6 != 0) {
      iVar1 = XYZ->red_X;
      iVar2 = XYZ->red_Y;
      pVar11 = 0;
      iVar7 = 0;
      if (iVar9 != 0) {
        dVar12 = floor(((double)iVar9 * 100000.0) / (double)iVar6 + 0.5);
        if (2147483647.0 < dVar12) {
          return 1;
        }
        if (dVar12 < -2147483648.0) {
          return 1;
        }
        iVar7 = (int)dVar12;
      }
      xy->greenx = iVar7;
      if (XYZ->green_Y != 0) {
        dVar12 = floor(((double)XYZ->green_Y * 100000.0) / (double)iVar6 + 0.5);
        if (2147483647.0 < dVar12) {
          return 1;
        }
        if (dVar12 < -2147483648.0) {
          return 1;
        }
        pVar11 = (png_fixed_point)dVar12;
      }
      xy->greeny = pVar11;
      iVar9 = XYZ->blue_X;
      iVar7 = XYZ->blue_Y + iVar9 + XYZ->blue_Z;
      if (iVar7 != 0) {
        iVar3 = XYZ->green_X;
        iVar4 = XYZ->green_Y;
        iVar8 = 0;
        if (iVar9 != 0) {
          dVar12 = floor(((double)iVar9 * 100000.0) / (double)iVar7 + 0.5);
          if (2147483647.0 < dVar12) {
            return 1;
          }
          if (dVar12 < -2147483648.0) {
            return 1;
          }
          iVar8 = (int)dVar12;
        }
        iVar9 = 0;
        xy->bluex = iVar8;
        if (XYZ->blue_Y != 0) {
          dVar12 = floor(((double)XYZ->blue_Y * 100000.0) / (double)iVar7 + 0.5);
          if (2147483647.0 < dVar12) {
            return 1;
          }
          if (dVar12 < -2147483648.0) {
            return 1;
          }
          iVar9 = (int)dVar12;
        }
        xy->bluey = iVar9;
        iVar7 = iVar6 + iVar10 + iVar7;
        if (iVar7 != 0) {
          iVar6 = 0;
          dVar12 = (double)iVar7;
          iVar9 = XYZ->blue_Y;
          iVar5 = 0;
          iVar10 = iVar1 + iVar3 + XYZ->blue_X;
          if (iVar10 != 0) {
            dVar13 = floor(((double)iVar10 * 100000.0) / dVar12 + 0.5);
            if (2147483647.0 < dVar13) {
              return 1;
            }
            if (dVar13 < -2147483648.0) {
              return 1;
            }
            iVar5 = (int)dVar13;
          }
          xy->whitex = iVar5;
          iVar9 = iVar2 + iVar4 + iVar9;
          if (iVar9 != 0) {
            dVar12 = floor(((double)iVar9 * 100000.0) / dVar12 + 0.5);
            if (2147483647.0 < dVar12) {
              return 1;
            }
            if (dVar12 < -2147483648.0) {
              return 1;
            }
            iVar6 = (int)dVar12;
          }
          xy->whitey = iVar6;
          iVar5 = 0;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int
png_xy_from_XYZ(png_xy *xy, const png_XYZ *XYZ)
{
   png_int_32 d, dwhite, whiteX, whiteY;

   d = XYZ->red_X + XYZ->red_Y + XYZ->red_Z;
   if (png_muldiv(&xy->redx, XYZ->red_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->redy, XYZ->red_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite = d;
   whiteX = XYZ->red_X;
   whiteY = XYZ->red_Y;

   d = XYZ->green_X + XYZ->green_Y + XYZ->green_Z;
   if (png_muldiv(&xy->greenx, XYZ->green_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->greeny, XYZ->green_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite += d;
   whiteX += XYZ->green_X;
   whiteY += XYZ->green_Y;

   d = XYZ->blue_X + XYZ->blue_Y + XYZ->blue_Z;
   if (png_muldiv(&xy->bluex, XYZ->blue_X, PNG_FP_1, d) == 0)
      return 1;
   if (png_muldiv(&xy->bluey, XYZ->blue_Y, PNG_FP_1, d) == 0)
      return 1;
   dwhite += d;
   whiteX += XYZ->blue_X;
   whiteY += XYZ->blue_Y;

   /* The reference white is simply the sum of the end-point (X,Y,Z) vectors,
    * thus:
    */
   if (png_muldiv(&xy->whitex, whiteX, PNG_FP_1, dwhite) == 0)
      return 1;
   if (png_muldiv(&xy->whitey, whiteY, PNG_FP_1, dwhite) == 0)
      return 1;

   return 0;
}